

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_align_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ArenaAlignDefault_CeilPtr_Test::TestBody
          (ArenaAlignDefault_CeilPtr_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_238;
  Message local_230;
  char *local_228;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_220;
  EqMatcher<char_*> local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_6;
  Message local_1f8;
  char *local_1f0;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_1e8;
  EqMatcher<char_*> local_1e0;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_5;
  Message local_1c0;
  char *local_1b8;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_1b0;
  EqMatcher<char_*> local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  Message local_188;
  char *local_180;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_178;
  EqMatcher<char_*> local_170;
  undefined1 local_168 [8];
  AssertionResult gtest_ar_3;
  Message local_150;
  char *local_148;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_140;
  EqMatcher<char_*> local_138;
  undefined1 local_130 [8];
  AssertionResult gtest_ar_2;
  Message local_118;
  char *local_110;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_108;
  EqMatcher<char_*> local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar_1;
  Message local_d0;
  char *local_c8;
  ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_> local_c0;
  EqMatcher<char_*> local_b8;
  undefined1 local_b0 [8];
  AssertionResult gtest_ar;
  char local_98 [7];
  ArenaAlignDefault align_default;
  char p [17];
  ArenaAlignDefault_CeilPtr_Test *this_local;
  uintptr_t intptr_6;
  uintptr_t intptr_5;
  uintptr_t intptr_4;
  uintptr_t intptr_3;
  uintptr_t intptr_2;
  uintptr_t intptr_1;
  uintptr_t intptr;
  
  unique0x10000aae = this;
  memset(local_98,0,0x11);
  memset((void *)((long)&gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 + 7),0,1);
  local_c0.rhs_ = (char *)testing::Eq<char*>(local_98);
  local_b8.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>.
  rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
         testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                   ((EqMatcher<char_*>)local_c0.rhs_);
  local_c8 = local_98;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_b0,(char *)&local_b8,(char **)"align_default.Ceil(p + 0)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b0);
  if (!bVar1) {
    testing::Message::Message(&local_d0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_b0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3c,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_d0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b0);
  local_108.rhs_ = (char *)testing::Eq<char*>(p);
  local_100.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_108.rhs_);
  local_110 = p;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_f8,(char *)&local_100,(char **)"align_default.Ceil(p + 1)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_118);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3d,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_118);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_118);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  local_140.rhs_ = (char *)testing::Eq<char*>(p);
  local_138.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_140.rhs_);
  local_148 = p;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_130,(char *)&local_138,(char **)"align_default.Ceil(p + 7)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_130);
  if (!bVar1) {
    testing::Message::Message(&local_150);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_130);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3e,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_150);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_150);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_130);
  local_178.rhs_ = (char *)testing::Eq<char*>(p);
  local_170.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_178.rhs_);
  local_180 = p;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_168,(char *)&local_170,(char **)"align_default.Ceil(p + 8)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_168);
  if (!bVar1) {
    testing::Message::Message(&local_188);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_168);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x3f,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_188);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_188);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_168);
  local_1b0.rhs_ = (char *)testing::Eq<char*>(p + 8);
  local_1a8.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_1b0.rhs_);
  local_1b8 = p + 8;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_1a0,(char *)&local_1a8,(char **)"align_default.Ceil(p + 9)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x40,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1e8.rhs_ = (char *)testing::Eq<char*>(p + 8);
  local_1e0.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_1e8.rhs_);
  local_1f0 = p + 8;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_1d8,(char *)&local_1e0,(char **)"align_default.Ceil(p + 15)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
  if (!bVar1) {
    testing::Message::Message(&local_1f8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x41,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_1f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
    testing::Message::~Message(&local_1f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
  local_220.rhs_ = (char *)testing::Eq<char*>(p + 8);
  local_218.super_ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>
  .rhs_ = (ComparisonBase<testing::internal::EqMatcher<char_*>,_char_*,_std::equal_to<void>_>)
          testing::internal::MakePredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>
                    ((EqMatcher<char_*>)local_220.rhs_);
  local_228 = p + 8;
  testing::internal::PredicateFormatterFromMatcher<testing::internal::EqMatcher<char*>>::operator()
            (local_210,(char *)&local_218,(char **)"align_default.Ceil(p + 16)");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
  if (!bVar1) {
    testing::Message::Message(&local_230);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
    testing::internal::AssertHelper::AssertHelper
              (&local_238,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_align_test.cc"
               ,0x42,pcVar2);
    testing::internal::AssertHelper::operator=(&local_238,&local_230);
    testing::internal::AssertHelper::~AssertHelper(&local_238);
    testing::Message::~Message(&local_230);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
  return;
}

Assistant:

TEST(ArenaAlignDefault, CeilPtr) {
  alignas(8) char p[17] = {0};
  auto align_default = ArenaAlignDefault();
  EXPECT_THAT(align_default.Ceil(p + 0), Eq(p + 0));
  EXPECT_THAT(align_default.Ceil(p + 1), Eq(p + 8));
  EXPECT_THAT(align_default.Ceil(p + 7), Eq(p + 8));
  EXPECT_THAT(align_default.Ceil(p + 8), Eq(p + 8));
  EXPECT_THAT(align_default.Ceil(p + 9), Eq(p + 16));
  EXPECT_THAT(align_default.Ceil(p + 15), Eq(p + 16));
  EXPECT_THAT(align_default.Ceil(p + 16), Eq(p + 16));
}